

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommMPI.cpp
# Opt level: O3

helper * __thiscall adios2::helper::CommDupMPI(helper *this,MPI_Comm mpiComm)

{
  MPI_Comm in_RAX;
  MPI_Comm newComm;
  MPI_Comm local_18;
  
  if (mpiComm == (MPI_Comm)&ompi_mpi_comm_null) {
    local_18 = (MPI_Comm)&ompi_mpi_comm_null;
  }
  else {
    local_18 = in_RAX;
    MPI_Comm_dup(mpiComm,&local_18);
  }
  CommWithMPI(this,local_18);
  return this;
}

Assistant:

Comm CommDupMPI(MPI_Comm mpiComm)
{
    MPI_Comm newComm;
    if (mpiComm != MPI_COMM_NULL)
    {
        MPI_Comm_dup(mpiComm, &newComm);
    }
    else
    {
        newComm = MPI_COMM_NULL;
    }
    return CommWithMPI(newComm);
}